

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

ON_Viewport * ON_Viewport::Cast(ON_Object *p)

{
  bool bVar1;
  ON_Viewport *pOVar2;
  
  if (p != (ON_Object *)0x0) {
    bVar1 = ON_Object::IsKindOf(p,&m_ON_Viewport_class_rtti);
    pOVar2 = (ON_Viewport *)0x0;
    if (bVar1) {
      pOVar2 = (ON_Viewport *)p;
    }
    return pOVar2;
  }
  return (ON_Viewport *)0x0;
}

Assistant:

static double len2d( double x, double y )
{
  double d= 0.0;
  double fx = fabs(x);
  double fy = fabs(y);
  if ( fx > fy ) {
    d = fy/fx;
    d = fx*sqrt(1.0+d*d);
  }
  else if ( fy > fx ){
    d = fx/fy;
    d = fy*sqrt(1.0+d*d);
  }
  return d;
}